

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::AttrHelper_FloatToString(X3DExporter *this,float pValue,string *pTargetString)

{
  string local_40;
  string *local_20;
  string *pTargetString_local;
  X3DExporter *pXStack_10;
  float pValue_local;
  X3DExporter *this_local;
  
  local_20 = pTargetString;
  pTargetString_local._4_4_ = pValue;
  pXStack_10 = this;
  std::__cxx11::to_string(&local_40,pValue);
  std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  AttrHelper_CommaToPoint(this,local_20);
  return;
}

Assistant:

void X3DExporter::AttrHelper_FloatToString(const float pValue, std::string& pTargetString)
{
	pTargetString = to_string(pValue);
	AttrHelper_CommaToPoint(pTargetString);
}